

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O0

void drawDetermineContainedTiles
               (IceTInt *contained_viewport,IceTDouble znear,IceTDouble zfar,IceTInt *contained_list
               ,IceTBoolean *contained_mask,IceTInt *num_contained_p)

{
  int local_48;
  int local_44;
  int i;
  IceTInt num_tiles;
  IceTInt *tile_viewports;
  IceTInt *num_contained_p_local;
  IceTBoolean *contained_mask_local;
  IceTInt *contained_list_local;
  IceTDouble zfar_local;
  IceTDouble znear_local;
  IceTInt *contained_viewport_local;
  
  tile_viewports = num_contained_p;
  num_contained_p_local = (IceTInt *)contained_mask;
  contained_mask_local = (IceTBoolean *)contained_list;
  contained_list_local = (IceTInt *)zfar;
  zfar_local = znear;
  znear_local = (IceTDouble)contained_viewport;
  _i = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x10,&local_44);
  *tile_viewports = 0;
  memset(num_contained_p_local,0,(long)local_44);
  for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
    if (((((double)zfar_local <= 1.0) && (-1.0 <= (double)contained_list_local)) &&
        (*(int *)znear_local < _i[local_48 << 2] + _i[local_48 * 4 + 2])) &&
       (((_i[local_48 << 2] < *(int *)znear_local + *(int *)((long)znear_local + 8) &&
         (*(int *)((long)znear_local + 4) < _i[local_48 * 4 + 1] + _i[local_48 * 4 + 3])) &&
        (_i[local_48 * 4 + 1] < *(int *)((long)znear_local + 4) + *(int *)((long)znear_local + 0xc))
        ))) {
      *(int *)(contained_mask_local + (long)*tile_viewports * 4) = local_48;
      *(undefined1 *)((long)num_contained_p_local + (long)local_48) = 1;
      *tile_viewports = *tile_viewports + 1;
    }
  }
  return;
}

Assistant:

static void drawDetermineContainedTiles(const IceTInt contained_viewport[4],
                                        IceTDouble znear, IceTDouble zfar,
                                        IceTInt *contained_list,
                                        IceTBoolean *contained_mask,
                                        IceTInt *num_contained_p)
{
    const IceTInt *tile_viewports;
    IceTInt num_tiles;
    int i;

    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);

    *num_contained_p = 0;
    memset(contained_mask, 0, sizeof(IceTBoolean)*num_tiles);
    for (i = 0; i < num_tiles; i++) {
        if (   (znear  <= 1.0)
            && (zfar   >= -1.0)
            && (  contained_viewport[0]
                < tile_viewports[i*4+0] + tile_viewports[i*4+2])
            && (  contained_viewport[0] + contained_viewport[2]
                > tile_viewports[i*4+0])
            && (  contained_viewport[1]
                < tile_viewports[i*4+1] + tile_viewports[i*4+3])
            && (  contained_viewport[1] + contained_viewport[3]
                > tile_viewports[i*4+1]) ) {
            contained_list[*num_contained_p] = i;
            contained_mask[i] = 1;
            (*num_contained_p)++;
        }
    }
}